

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

void Wlc_NtkCreateMemoryConstr
               (Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vMemObjsClean,Vec_Int_t *vReachReadCi)

{
  Vec_Int_t *p_00;
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Wlc_Obj_t *pWVar7;
  Vec_Int_t *p_04;
  Wlc_Obj_t *pWVar8;
  Wlc_Obj_t *pWVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  p_01 = Wlc_NtkCollectOneType(p,vMemObjsClean,0x36,-1);
  p_02 = Wlc_NtkCollectOneType(p,vMemObjsClean,1,3);
  p_03 = Vec_IntAlloc(10);
  iVar2 = p_01->nSize;
  p_00 = &p->vCopies;
  iVar12 = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  do {
    if (iVar12 == iVar2) {
      iVar2 = p_02->nSize;
      iVar12 = 0;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      for (; iVar2 != iVar12; iVar12 = iVar12 + 1) {
        iVar3 = Vec_IntEntry(p_02,iVar12);
        pWVar7 = Wlc_NtkObj(p,iVar3);
        Vec_IntWriteEntry(p_00,(int)(((long)pWVar7 - (long)p->pObjs) / 0x18),-1);
      }
      Vec_IntFree(p_03);
      Vec_IntFree(p_01);
      Vec_IntFree(p_02);
      return;
    }
    iVar3 = Vec_IntEntry(p_01,iVar12);
    pWVar7 = Wlc_NtkObj(p,iVar3);
    p_04 = Wlc_NtkExtractCisForThisRead(vReachReadCi,(int)(((long)pWVar7 - (long)p->pObjs) / 0x18));
    iVar3 = p_02->nSize;
    iVar11 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
      iVar11 = 0;
    }
    for (; iVar3 != iVar11; iVar11 = iVar11 + 1) {
      iVar4 = Vec_IntEntry(p_02,iVar11);
      pWVar8 = Wlc_NtkObj(p,iVar4);
      Vec_IntWriteEntry(p_00,(int)(((long)pWVar8 - (long)p->pObjs) / 0x18),-1);
    }
    iVar3 = p_04->nSize;
    for (iVar11 = 1; iVar11 < iVar3; iVar11 = iVar11 + 2) {
      iVar4 = Vec_IntEntry(p_04,iVar11 + -1);
      iVar5 = Vec_IntEntry(p_04,iVar11);
      Vec_IntWriteEntry(p_00,iVar4,iVar5);
    }
    Vec_IntFree(p_04);
    for (iVar3 = 0; iVar3 < vMemObjsClean->nSize; iVar3 = iVar3 + 1) {
      iVar11 = Vec_IntEntry(vMemObjsClean,iVar3);
      pWVar8 = Wlc_NtkObj(p,iVar11);
      if ((undefined1  [24])((undefined1  [24])*pWVar8 & (undefined1  [24])0x3d) !=
          (undefined1  [24])0x1 &&
          (undefined1  [24])((undefined1  [24])*pWVar8 & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x36) {
        Vec_IntWriteEntry(p_00,(int)(((long)pWVar8 - (long)p->pObjs) / 0x18),-1);
        uVar1 = *(ushort *)pWVar8 & 0x3f;
        if (uVar1 == 7) {
          iVar11 = Wlc_ObjFaninId0(pWVar8);
          iVar11 = Vec_IntEntry(p_00,iVar11);
          if (iVar11 != -1) {
LAB_003040b6:
            Vec_IntWriteEntry(p_00,(int)(((long)pWVar8 - (long)p->pObjs) / 0x18),iVar11);
          }
        }
        else if (uVar1 == 8) {
          iVar11 = Wlc_ObjFaninId1(pWVar8);
          iVar5 = Vec_IntEntry(p_00,iVar11);
          iVar11 = Wlc_ObjFaninId2(pWVar8);
          iVar4 = Vec_IntEntry(p_00,iVar11);
          if (iVar4 != -1 && iVar5 != -1) {
            iVar6 = pWVar7->End - pWVar7->Beg;
            iVar11 = -iVar6;
            if (0 < iVar6) {
              iVar11 = iVar6;
            }
            pWVar9 = Wlc_NtkObj(pNew,iVar5);
            iVar10 = pWVar9->End - pWVar9->Beg;
            iVar6 = -iVar10;
            if (0 < iVar10) {
              iVar6 = iVar10;
            }
            if (iVar11 != iVar6) {
              __assert_fail("Wlc_ObjRange(pObjR) == Wlc_ObjRange(Wlc_NtkObj(pNew, iFanin0New))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                            ,0x53b,
                            "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            iVar6 = pWVar7->End - pWVar7->Beg;
            iVar11 = -iVar6;
            if (0 < iVar6) {
              iVar11 = iVar6;
            }
            pWVar9 = Wlc_NtkObj(pNew,iVar4);
            iVar10 = pWVar9->End - pWVar9->Beg;
            iVar6 = -iVar10;
            if (0 < iVar10) {
              iVar6 = iVar10;
            }
            if (iVar11 != iVar6) {
              __assert_fail("Wlc_ObjRange(pObjR) == Wlc_ObjRange(Wlc_NtkObj(pNew, iFanin1New))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                            ,0x53c,
                            "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            iVar6 = pWVar7->End - pWVar7->Beg;
            iVar11 = -iVar6;
            if (0 < iVar6) {
              iVar11 = iVar6;
            }
            iVar11 = Wlc_ObjAlloc(pNew,8,0,iVar11,0);
            iVar6 = Wlc_ObjFaninId0(pWVar8);
            iVar6 = Vec_IntEntry(p_00,iVar6);
            Vec_IntFill(p_03,1,iVar6);
            Vec_IntPush(p_03,iVar5);
LAB_0030406a:
            Vec_IntPush(p_03,iVar4);
            pWVar9 = Wlc_NtkObj(pNew,iVar11);
            Wlc_ObjAddFanins(pNew,pWVar9,p_03);
            goto LAB_003040b6;
          }
        }
        else {
          if (uVar1 != 0x37) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                          ,0x549,
                          "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          iVar11 = Wlc_ObjFaninId0(pWVar8);
          iVar11 = Vec_IntEntry(p_00,iVar11);
          if (iVar11 != -1) {
            iVar4 = pWVar7->End - pWVar7->Beg;
            iVar11 = -iVar4;
            if (0 < iVar4) {
              iVar11 = iVar4;
            }
            pWVar9 = Wlc_ObjFanin2(p,pWVar8);
            iVar5 = pWVar9->End - pWVar9->Beg;
            iVar4 = -iVar5;
            if (0 < iVar5) {
              iVar4 = iVar5;
            }
            if (iVar11 == iVar4) {
              iVar11 = Wlc_ObjAlloc(pNew,0x1f,0,0,0);
              pWVar9 = Wlc_NtkObj(pNew,iVar11);
              iVar11 = Wlc_ObjFaninId1(pWVar7);
              iVar11 = Vec_IntEntry(p_00,iVar11);
              iVar4 = Wlc_ObjFaninId1(pWVar8);
              iVar4 = Vec_IntEntry(p_00,iVar4);
              Vec_IntFillTwo(p_03,2,iVar11,iVar4);
              Wlc_ObjAddFanins(pNew,pWVar9,p_03);
              iVar4 = pWVar7->End - pWVar7->Beg;
              iVar11 = -iVar4;
              if (0 < iVar4) {
                iVar11 = iVar4;
              }
              iVar11 = Wlc_ObjAlloc(pNew,8,0,iVar11,0);
              Vec_IntFill(p_03,1,(int)(((long)pWVar9 - (long)pNew->pObjs) / 0x18));
              iVar4 = Wlc_ObjFaninId2(pWVar8);
              iVar4 = Vec_IntEntry(p_00,iVar4);
              Vec_IntPush(p_03,iVar4);
              iVar4 = Wlc_ObjFaninId0(pWVar8);
              iVar4 = Vec_IntEntry(p_00,iVar4);
              goto LAB_0030406a;
            }
          }
        }
      }
    }
    iVar3 = Wlc_ObjFaninId0(pWVar7);
    iVar3 = Vec_IntEntry(p_00,iVar3);
    if (iVar3 == -1) {
      __assert_fail("iObjNew != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                    ,0x54e,
                    "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    Vec_IntFill(p_03,1,iVar3);
    iVar3 = Vec_IntEntry(p_00,(int)(((long)pWVar7 - (long)p->pObjs) / 0x18));
    pWVar7 = Wlc_NtkObj(pNew,iVar3);
    if ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x7) {
      __assert_fail("Wlc_NtkObj(pNew, iObjNew)->Type == WLC_OBJ_BUF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                    ,0x552,
                    "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    pWVar7 = Wlc_NtkObj(pNew,iVar3);
    Wlc_ObjAddFanins(pNew,pWVar7,p_03);
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

void Wlc_NtkCreateMemoryConstr( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vMemObjsClean, Vec_Int_t * vReachReadCi )
{
    Vec_Int_t * vReads  = Wlc_NtkCollectOneType( p, vMemObjsClean, WLC_OBJ_READ, -1 );
    Vec_Int_t * vObjCis = Wlc_NtkCollectOneType( p, vMemObjsClean, WLC_OBJ_PI, WLC_OBJ_FO );
    Vec_Int_t * vFanins = Vec_IntAlloc( 10 );
    Wlc_Obj_t * pObjR, * pObj, * pCond; 
    int i, k, iObjCi, iObjNew = -1;
    // go through read ports
    Wlc_NtkForEachObjVec( vReads, p, pObjR, i )
    {
        // ABC_READ  ( .mem_in(mem_fi1), .addr(raddr), .data(read1) ) ;
        // ABC_WRITE ( .mem_in(mem_fo1), .addr(waddr), .data(data), .mem_out(mem_fi1) ) ;
        // initialize CI related to the read port
        Vec_Int_t * vLocalCis = Wlc_NtkExtractCisForThisRead( vReachReadCi, Wlc_ObjId(p, pObjR) );
        Wlc_NtkForEachObjVec( vObjCis, p, pObj, k )
            Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), -1 );
        Vec_IntForEachEntryDouble( vLocalCis, iObjCi, iObjNew, k )
            Wlc_ObjSetCopy( p, iObjCi, iObjNew );
        Vec_IntFree( vLocalCis );
        // implement the nodes
        Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, k )
        {
            if ( Wlc_ObjIsRead(pObj) || Wlc_ObjIsCi(pObj) )
                continue;
            Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), -1 );
            if ( Wlc_ObjIsWrite(pObj) )
            {
                if ( Wlc_ObjCopy(p, Wlc_ObjFaninId0(pObj)) == -1 )
                    continue;
                if ( Wlc_ObjRange(pObjR) != Wlc_ObjRange(Wlc_ObjFanin2(p, pObj)) )
                    continue;
                // create equality
                pCond = Wlc_NtkObj( pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_EQU, 0, 0, 0) );
                Vec_IntFillTwo( vFanins, 2, Wlc_ObjCopy(p, Wlc_ObjFaninId1(pObjR)), Wlc_ObjCopy(p, Wlc_ObjFaninId1(pObj)) );
                //printf( "%d : ", Wlc_ObjId(p,pObj) ), Vec_IntPrint( vFanins );
                Wlc_ObjAddFanins( pNew, pCond, vFanins );
                // create MUX
                iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, Wlc_ObjRange(pObjR)-1, 0 );
                Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pCond) );
                Vec_IntPush( vFanins, Wlc_ObjCopy(p, Wlc_ObjFaninId2(pObj)) );
                Vec_IntPush( vFanins, Wlc_ObjCopy(p, Wlc_ObjFaninId0(pObj)) );
                Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
            }
            else if ( Wlc_ObjIsMux(pObj) )
            {
                int iFanin0New = Wlc_ObjCopy(p, Wlc_ObjFaninId1(pObj));
                int iFanin1New = Wlc_ObjCopy(p, Wlc_ObjFaninId2(pObj));
                if ( iFanin0New == -1 || iFanin1New == -1 )
                    continue;
                //Wlc_NtkPrintNode( pNew, Wlc_NtkObj(pNew, iFanin0New) );
                assert( Wlc_ObjRange(pObjR) == Wlc_ObjRange(Wlc_NtkObj(pNew, iFanin0New)) );
                assert( Wlc_ObjRange(pObjR) == Wlc_ObjRange(Wlc_NtkObj(pNew, iFanin1New)) );
                iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, Wlc_ObjRange(pObjR)-1, 0 );
                Vec_IntFill( vFanins, 1, Wlc_ObjCopy(p, Wlc_ObjFaninId0(pObj)) );
                Vec_IntPush( vFanins, iFanin0New );
                Vec_IntPush( vFanins, iFanin1New );
                Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
            }
            else if ( Wlc_ObjIsBuf(pObj) )
            {
                iObjNew = Wlc_ObjCopy( p, Wlc_ObjFaninId0(pObj) );
                if ( iObjNew == -1 )
                    continue;
            }
            else assert( 0 );
            Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), iObjNew );
        }
        // extract fanin
        iObjNew = Wlc_ObjCopy( p, Wlc_ObjFaninId0(pObjR) );
        assert( iObjNew != -1 );
        Vec_IntFill( vFanins, 1, iObjNew );
        // add it as buffer fanin
        iObjNew = Wlc_ObjCopy( p, Wlc_ObjId(p, pObjR) );
        assert( Wlc_NtkObj(pNew, iObjNew)->Type == WLC_OBJ_BUF );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
    }
    Wlc_NtkForEachObjVec( vObjCis, p, pObj, k )
        Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), -1 );
    Vec_IntFree( vFanins );
    Vec_IntFree( vReads );
    Vec_IntFree( vObjCis );
}